

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O2

unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
__thiscall flatbuffers::FlatBufFile::service(FlatBufFile *this,int i)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  int in_EDX;
  undefined4 in_register_00000034;
  
  pp_Var2 = (_func_int **)operator_new(0x10);
  p_Var1 = *(_func_int **)
            (*(long *)(*(long *)(CONCAT44(in_register_00000034,i) + 8) + 0x168) + (long)in_EDX * 8);
  *pp_Var2 = (_func_int *)&PTR__CommentHolder_002fb220;
  pp_Var2[1] = p_Var1;
  (this->super_File).super_CommentHolder._vptr_CommentHolder = pp_Var2;
  return (__uniq_ptr_data<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>,_true,_true>
          )(__uniq_ptr_data<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const grpc_generator::Service> service(int i) const {
    return std::unique_ptr<const grpc_generator::Service>(
        new FlatBufService(parser_.services_.vec[i]));
  }